

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

void lws_cancel_service(lws_context *context)

{
  lws_log_cx *cx;
  short local_1a;
  lws_context_per_thread *plStack_18;
  short m;
  lws_context_per_thread *pt;
  lws_context *context_local;
  
  plStack_18 = context->pt;
  if ((*(ushort *)&context->field_0x7b7 >> 3 & 1) == 0) {
    cx = lwsl_context_get_cx(context);
    _lws_log_cx(cx,lws_log_prepend_context,context,0x10,"lws_cancel_service","\n");
    for (local_1a = 0; (int)local_1a < (int)(uint)context->count_threads; local_1a = local_1a + 1) {
      if (plStack_18->pipe_wsi != (lws *)0x0) {
        lws_plat_pipe_signal(plStack_18->context,(int)local_1a);
      }
      plStack_18 = plStack_18 + 1;
    }
  }
  return;
}

Assistant:

void
lws_cancel_service(struct lws_context *context)
{
	struct lws_context_per_thread *pt = &context->pt[0];
	short m;

	if (context->service_no_longer_possible)
		return;

	lwsl_cx_debug(context, "\n");

	for (m = 0; m < context->count_threads; m++) {
		if (pt->pipe_wsi)
			lws_plat_pipe_signal(pt->context, m);
		pt++;
	}
}